

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spec_reporter.h
# Opt level: O1

void __thiscall bandit::detail::spec_reporter::it_succeeded(spec_reporter *this,char *desc)

{
  int *piVar1;
  char cVar2;
  long lVar3;
  char *pcVar4;
  bool bVar5;
  
  piVar1 = &(this->super_progress_reporter).specs_succeeded_;
  *piVar1 = *piVar1 + 1;
  pcVar4 = "\x1b[1;32m";
  bVar5 = this->colorizer_->colors_enabled_ == false;
  if (bVar5) {
    pcVar4 = "";
  }
  lVar3 = 7;
  if (bVar5) {
    lVar3 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>(this->stm_,pcVar4,lVar3);
  std::__ostream_insert<char,std::char_traits<char>>(this->stm_,"OK",2);
  bVar5 = this->colorizer_->colors_enabled_;
  pcVar4 = "\x1b[0m";
  if (bVar5 == false) {
    pcVar4 = "";
  }
  std::__ostream_insert<char,std::char_traits<char>>(this->stm_,pcVar4,(ulong)bVar5 << 2);
  cVar2 = (char)this->stm_;
  std::ios::widen((char)*(undefined8 *)(*(long *)this->stm_ + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::ostream::flush();
  return;
}

Assistant:

virtual void it_succeeded(const char* desc)
    {
      progress_reporter::it_succeeded(desc);
      stm_ << colorizer_.green();
	  stm_ << "OK";
	  stm_ << colorizer_.reset();
	  stm_ << std::endl;
      stm_.flush();
    }